

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O3

void __thiscall cmLocalGenerator::GenerateInstallRules(cmLocalGenerator *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmMakefile *pcVar2;
  pointer pcVar3;
  pointer puVar4;
  cmInstallGenerator *pcVar5;
  pointer pbVar6;
  cmLocalGenerator *pcVar7;
  int iVar8;
  cmValue cVar9;
  string *psVar10;
  long lVar11;
  undefined8 extraout_RAX;
  ostream *poVar12;
  PolicyID id;
  pointer this_00;
  const_iterator __begin2;
  undefined *puVar13;
  pointer puVar14;
  const_iterator __end2;
  string *configurationType;
  pointer s;
  bool bVar15;
  bool haveInstallAfterSubdirectory;
  bool haveSubdirectoryInstall;
  string odir;
  string prefix;
  string default_config;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configurationTypes;
  string homedir;
  vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_> children;
  string file;
  string config;
  ostringstream e;
  cmGeneratedFileStream fout;
  char local_516 [2];
  undefined4 local_514;
  string local_510;
  PolicyStatus local_4ec;
  long *local_4e8;
  char *local_4e0;
  long local_4d8 [2];
  long *local_4c8;
  long local_4c0;
  long local_4b8 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_4a8;
  long *local_490;
  size_t local_488;
  long local_480 [2];
  cmLocalGenerator *local_470;
  vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_> local_468;
  string local_450;
  string local_430;
  undefined1 local_410 [16];
  cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> local_400 [2];
  ios_base local_3a0 [264];
  undefined1 local_298 [616];
  
  pcVar2 = this->Makefile;
  local_298._0_8_ = local_298 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_298,"CMAKE_INSTALL_PREFIX","");
  cVar9 = cmMakefile::GetDefinition(pcVar2,(string *)local_298);
  if ((undefined1 *)local_298._0_8_ != local_298 + 0x10) {
    operator_delete((void *)local_298._0_8_,local_298._16_8_ + 1);
  }
  psVar10 = cVar9.Value;
  if (cVar9.Value == (string *)0x0) {
    psVar10 = &cmValue::Empty_abi_cxx11_;
  }
  local_4e8 = local_4d8;
  pcVar3 = (psVar10->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_4e8,pcVar3,pcVar3 + psVar10->_M_string_length);
  if (cVar9.Value == (string *)0x0) {
    std::__cxx11::string::_M_replace((ulong)&local_4e8,0,local_4e0,0x756a59);
  }
  pcVar2 = this->Makefile;
  local_298._0_8_ = local_298 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_298,"CMAKE_STAGING_PREFIX","");
  cVar9 = cmMakefile::GetDefinition(pcVar2,(string *)local_298);
  if ((undefined1 *)local_298._0_8_ != local_298 + 0x10) {
    operator_delete((void *)local_298._0_8_,local_298._16_8_ + 1);
  }
  if (cVar9.Value != (string *)0x0) {
    std::__cxx11::string::_M_assign((string *)&local_4e8);
  }
  cmMakefile::GetGeneratorConfigs_abi_cxx11_(&local_4a8,this->Makefile,OnlyMultiConfig);
  cmMakefile::GetDefaultConfiguration_abi_cxx11_(&local_430,this->Makefile);
  local_4c8 = local_4b8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_4c8,local_430._M_dataplus._M_p,
             local_430._M_dataplus._M_p + local_430._M_string_length);
  local_470 = this;
  if (local_4c0 == 0) {
    puVar13 = &DAT_0094d8a0;
    lVar11 = 0;
    do {
      pbVar6 = local_4a8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      s = local_4a8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
      if (local_4a8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          local_4a8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        bVar15 = true;
      }
      else {
        do {
          cmsys::SystemTools::UpperCase((string *)local_298,s);
          iVar8 = std::__cxx11::string::compare((char *)local_298);
          if ((undefined1 *)local_298._0_8_ != local_298 + 0x10) {
            operator_delete((void *)local_298._0_8_,local_298._16_8_ + 1);
          }
          if (iVar8 == 0) {
            std::__cxx11::string::_M_assign((string *)&local_4c8);
          }
          s = s + 1;
        } while (s != pbVar6);
        bVar15 = local_4c0 == 0;
        lVar11 = local_4c0;
      }
      this = local_470;
    } while ((*(long *)(puVar13 + 8) != 0) && (puVar13 = puVar13 + 8, bVar15));
    if ((lVar11 == 0) &&
       (local_4a8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_4a8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)) {
      std::__cxx11::string::_M_assign((string *)&local_4c8);
    }
  }
  cmStateSnapshot::GetDirectory
            ((cmStateDirectory *)local_298,&(this->super_cmOutputConverter).StateSnapshot);
  psVar10 = cmStateDirectory::GetCurrentBinary_abi_cxx11_((cmStateDirectory *)local_298);
  local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
  pcVar3 = (psVar10->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_450,pcVar3,pcVar3 + psVar10->_M_string_length);
  psVar10 = cmState::GetBinaryDirectory_abi_cxx11_
                      ((this->GlobalGenerator->CMakeInstance->State)._M_t.
                       super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                       super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                       super__Head_base<0UL,_cmState_*,_false>._M_head_impl);
  local_490 = local_480;
  pcVar3 = (psVar10->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_490,pcVar3,pcVar3 + psVar10->_M_string_length);
  if (local_450._M_string_length == local_488) {
    if (local_450._M_string_length == 0) {
      local_514 = (undefined4)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
    }
    else {
      iVar8 = bcmp(local_450._M_dataplus._M_p,local_490,local_450._M_string_length);
      local_514 = CONCAT31((int3)((uint)iVar8 >> 8),iVar8 == 0);
    }
  }
  else {
    local_514 = 0;
  }
  std::__cxx11::string::append((char *)&local_450);
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)local_298,&local_450,false,None);
  cmGeneratedFileStream::SetCopyIfDifferent((cmGeneratedFileStream *)local_298,true);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_298,"# Install script for directory: ",0x20);
  cmStateSnapshot::GetDirectory
            ((cmStateDirectory *)local_410,&(this->super_cmOutputConverter).StateSnapshot);
  psVar10 = cmStateDirectory::GetCurrentSource_abi_cxx11_((cmStateDirectory *)local_410);
  poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_298,(psVar10->_M_dataplus)._M_p,psVar10->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar12,
             "\n\n# Set the install prefix\nif(NOT DEFINED CMAKE_INSTALL_PREFIX)\n  set(CMAKE_INSTALL_PREFIX \""
             ,0x5c);
  poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar12,(char *)local_4e8,(long)local_4e0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\")\nendif()\n",0xb);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar12,"string(REGEX REPLACE \"/$\" \"\" CMAKE_INSTALL_PREFIX ",0x32);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar12,"\"${CMAKE_INSTALL_PREFIX}\")\n\n",0x1c);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_298,
             "# Set the install configuration name.\nif(NOT DEFINED CMAKE_INSTALL_CONFIG_NAME)\n  if(BUILD_TYPE)\n    string(REGEX REPLACE \"^[^A-Za-z0-9_]+\" \"\"\n           CMAKE_INSTALL_CONFIG_NAME \"${BUILD_TYPE}\")\n  else()\n    set(CMAKE_INSTALL_CONFIG_NAME \""
             ,0xf1);
  poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_298,(char *)local_4c8,local_4c0);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar12,
             "\")\n  endif()\n  message(STATUS \"Install configuration: \\\"${CMAKE_INSTALL_CONFIG_NAME}\\\"\")\nendif()\n\n"
             ,0x62);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_298,
             "# Set the component getting installed.\nif(NOT CMAKE_INSTALL_COMPONENT)\n  if(COMPONENT)\n    message(STATUS \"Install component: \\\"${COMPONENT}\\\"\")\n    set(CMAKE_INSTALL_COMPONENT \"${COMPONENT}\")\n  else()\n    set(CMAKE_INSTALL_COMPONENT)\n  endif()\nendif()\n\n"
             ,0xfe);
  pcVar2 = this->Makefile;
  local_410._0_8_ = local_400;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_410,"CMAKE_INSTALL_SO_NO_EXE","");
  cVar9 = cmMakefile::GetDefinition(pcVar2,(string *)local_410);
  if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_410._0_8_ != local_400) {
    operator_delete((void *)local_410._0_8_,
                    (ulong)((long)local_400[0].Data.
                                  super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
                                  ._M_impl.super__Vector_impl_data._M_start + 1));
  }
  if (cVar9.Value != (string *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_298,
               "# Install shared libraries without execute permission?\nif(NOT DEFINED CMAKE_INSTALL_SO_NO_EXE)\n  set(CMAKE_INSTALL_SO_NO_EXE \""
               ,0x7e);
    poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_298,((cVar9.Value)->_M_dataplus)._M_p,
                         (cVar9.Value)->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\")\nendif()\n\n",0xc);
  }
  pcVar2 = this->Makefile;
  local_410._0_8_ = local_400;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_410,"CMAKE_CROSSCOMPILING","");
  cVar9 = cmMakefile::GetDefinition(pcVar2,(string *)local_410);
  if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_410._0_8_ != local_400) {
    operator_delete((void *)local_410._0_8_,
                    (ulong)((long)local_400[0].Data.
                                  super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
                                  ._M_impl.super__Vector_impl_data._M_start + 1));
  }
  if (cVar9.Value != (string *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_298,
               "# Is this installation the result of a crosscompile?\nif(NOT DEFINED CMAKE_CROSSCOMPILING)\n  set(CMAKE_CROSSCOMPILING \""
               ,0x76);
    poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_298,((cVar9.Value)->_M_dataplus)._M_p,
                         (cVar9.Value)->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\")\nendif()\n\n",0xc);
  }
  pcVar2 = this->Makefile;
  local_410._0_8_ = local_400;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_410,"CMAKE_INSTALL_DEFAULT_DIRECTORY_PERMISSIONS","");
  cVar9 = cmMakefile::GetDefinition(pcVar2,(string *)local_410);
  if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_410._0_8_ != local_400) {
    operator_delete((void *)local_410._0_8_,
                    (ulong)((long)local_400[0].Data.
                                  super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
                                  ._M_impl.super__Vector_impl_data._M_start + 1));
  }
  if (cVar9.Value != (string *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_298,
               "# Set default install directory permissions.\nif(NOT DEFINED CMAKE_INSTALL_DEFAULT_DIRECTORY_PERMISSIONS)\n  set(CMAKE_INSTALL_DEFAULT_DIRECTORY_PERMISSIONS \""
               ,0x9c);
    poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_298,((cVar9.Value)->_M_dataplus)._M_p,
                         (cVar9.Value)->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\")\nendif()\n\n",0xc);
  }
  pcVar2 = this->Makefile;
  local_410._0_8_ = local_400;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_410,"CMAKE_GET_RUNTIME_DEPENDENCIES_PLATFORM","");
  cVar9 = cmMakefile::GetDefinition(pcVar2,(string *)local_410);
  if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_410._0_8_ != local_400) {
    operator_delete((void *)local_410._0_8_,
                    (ulong)((long)local_400[0].Data.
                                  super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
                                  ._M_impl.super__Vector_impl_data._M_start + 1));
  }
  if (cVar9.Value != (string *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_298,
               "# Set default install directory permissions.\nif(NOT DEFINED CMAKE_GET_RUNTIME_DEPENDENCIES_PLATFORM)\n  set(CMAKE_GET_RUNTIME_DEPENDENCIES_PLATFORM \""
               ,0x94);
    poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_298,((cVar9.Value)->_M_dataplus)._M_p,
                         (cVar9.Value)->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\")\nendif()\n\n",0xc);
  }
  pcVar2 = this->Makefile;
  local_410._0_8_ = local_400;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_410,"CMAKE_GET_RUNTIME_DEPENDENCIES_TOOL","");
  cVar9 = cmMakefile::GetDefinition(pcVar2,(string *)local_410);
  if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_410._0_8_ != local_400) {
    operator_delete((void *)local_410._0_8_,
                    (ulong)((long)local_400[0].Data.
                                  super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
                                  ._M_impl.super__Vector_impl_data._M_start + 1));
  }
  if (cVar9.Value != (string *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_298,
               "# Set default install directory permissions.\nif(NOT DEFINED CMAKE_GET_RUNTIME_DEPENDENCIES_TOOL)\n  set(CMAKE_GET_RUNTIME_DEPENDENCIES_TOOL \""
               ,0x8c);
    poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_298,((cVar9.Value)->_M_dataplus)._M_p,
                         (cVar9.Value)->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\")\nendif()\n\n",0xc);
  }
  pcVar2 = this->Makefile;
  local_410._0_8_ = local_400;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_410,"CMAKE_GET_RUNTIME_DEPENDENCIES_COMMAND","");
  cVar9 = cmMakefile::GetDefinition(pcVar2,(string *)local_410);
  if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_410._0_8_ != local_400) {
    operator_delete((void *)local_410._0_8_,
                    (ulong)((long)local_400[0].Data.
                                  super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
                                  ._M_impl.super__Vector_impl_data._M_start + 1));
  }
  if (cVar9.Value != (string *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_298,
               "# Set default install directory permissions.\nif(NOT DEFINED CMAKE_GET_RUNTIME_DEPENDENCIES_COMMAND)\n  set(CMAKE_GET_RUNTIME_DEPENDENCIES_COMMAND \""
               ,0x92);
    poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_298,((cVar9.Value)->_M_dataplus)._M_p,
                         (cVar9.Value)->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\")\nendif()\n\n",0xc);
  }
  pcVar2 = this->Makefile;
  local_410._0_8_ = local_400;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_410,"CMAKE_OBJDUMP","");
  cVar9 = cmMakefile::GetDefinition(pcVar2,(string *)local_410);
  if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_410._0_8_ != local_400) {
    operator_delete((void *)local_410._0_8_,
                    (ulong)((long)local_400[0].Data.
                                  super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
                                  ._M_impl.super__Vector_impl_data._M_start + 1));
  }
  if (cVar9.Value != (string *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_298,
               "# Set default install directory permissions.\nif(NOT DEFINED CMAKE_OBJDUMP)\n  set(CMAKE_OBJDUMP \""
               ,0x60);
    poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_298,((cVar9.Value)->_M_dataplus)._M_p,
                         (cVar9.Value)->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\")\nendif()\n\n",0xc);
  }
  (*this->_vptr_cmLocalGenerator[0x12])(this,local_298);
  local_4ec = cmMakefile::GetPolicyStatus(this->Makefile,CMP0082,false);
  local_516[1] = 0;
  local_516[0] = '\0';
  puVar14 = (this->Makefile->InstallGenerators).
            super__Vector_base<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>,_std::allocator<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar4 = (this->Makefile->InstallGenerators).
           super__Vector_base<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>,_std::allocator<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (local_4ec == WARN) {
    if (puVar14 != puVar4) {
      do {
        pcVar5 = (puVar14->_M_t).
                 super___uniq_ptr_impl<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_cmInstallGenerator_*,_std::default_delete<cmInstallGenerator>_>
                 .super__Head_base<0UL,_cmInstallGenerator_*,_false>._M_head_impl;
        (**(code **)((long)(pcVar5->super_cmScriptGenerator)._vptr_cmScriptGenerator + 0x48))
                  (pcVar5,local_516 + 1,local_516);
        cmScriptGenerator::Generate
                  (&((puVar14->_M_t).
                     super___uniq_ptr_impl<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cmInstallGenerator_*,_std::default_delete<cmInstallGenerator>_>
                     .super__Head_base<0UL,_cmInstallGenerator_*,_false>._M_head_impl)->
                    super_cmScriptGenerator,(ostream *)local_298,&local_430,&local_4a8);
        puVar14 = puVar14 + 1;
      } while (puVar14 != puVar4);
    }
  }
  else if (puVar14 != puVar4) {
    do {
      cmScriptGenerator::Generate
                (&((puVar14->_M_t).
                   super___uniq_ptr_impl<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_cmInstallGenerator_*,_std::default_delete<cmInstallGenerator>_>
                   .super__Head_base<0UL,_cmInstallGenerator_*,_false>._M_head_impl)->
                  super_cmScriptGenerator,(ostream *)local_298,&local_430,&local_4a8);
      puVar14 = puVar14 + 1;
    } while (puVar14 != puVar4);
  }
  pcVar7 = local_470;
  GenerateTargetInstallRules(local_470,(ostream *)local_298,&local_430,&local_4a8);
  if (local_4ec != OLD) {
    if (local_4ec != WARN) goto LAB_0027897c;
    if (local_516[0] == '\x01') {
      pcVar2 = pcVar7->Makefile;
      local_410._0_8_ = local_400;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_410,"CMAKE_POLICY_WARNING_CMP0082","");
      bVar15 = cmMakefile::PolicyOptionalWarningEnabled(pcVar2,(string *)local_410);
      if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_410._0_8_ != local_400
         ) {
        operator_delete((void *)local_410._0_8_,
                        (ulong)((long)local_400[0].Data.
                                      super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
                                      ._M_impl.super__Vector_impl_data._M_start + 1));
      }
      if (bVar15) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_410);
        cmPolicies::GetPolicyWarning_abi_cxx11_(&local_510,(cmPolicies *)0x52,id);
        poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_410,local_510._M_dataplus._M_p,
                             local_510._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_510._M_dataplus._M_p != &local_510.field_2) {
          operator_delete(local_510._M_dataplus._M_p,local_510.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::stringbuf::str();
        cmake::IssueMessage(pcVar7->GlobalGenerator->CMakeInstance,AUTHOR_WARNING,&local_510,
                            &pcVar7->DirectoryBacktrace);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_510._M_dataplus._M_p != &local_510.field_2) {
          operator_delete(local_510._M_dataplus._M_p,local_510.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_410);
        std::ios_base::~ios_base(local_3a0);
      }
    }
  }
  cmMakefile::GetStateSnapshot(pcVar7->Makefile);
  cmStateSnapshot::GetChildren(&local_468,(cmStateSnapshot *)local_410);
  if (local_468.super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_468.super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_298,"if(NOT CMAKE_INSTALL_LOCAL_ONLY)\n",0x21);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_298,"  # Include the install script for each subdirectory.\n",0x36);
    if (local_468.super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_468.super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      paVar1 = &local_510.field_2;
      this_00 = local_468.super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>.
                _M_impl.super__Vector_impl_data._M_start;
      do {
        cmStateSnapshot::GetDirectory((cmStateDirectory *)local_410,this_00);
        local_510._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_510,"EXCLUDE_FROM_ALL","");
        bVar15 = cmStateDirectory::GetPropertyAsBool((cmStateDirectory *)local_410,&local_510);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_510._M_dataplus._M_p != paVar1) {
          operator_delete(local_510._M_dataplus._M_p,local_510.field_2._M_allocated_capacity + 1);
        }
        if (!bVar15) {
          cmStateSnapshot::GetDirectory((cmStateDirectory *)local_410,this_00);
          psVar10 = cmStateDirectory::GetCurrentBinary_abi_cxx11_((cmStateDirectory *)local_410);
          pcVar3 = (psVar10->_M_dataplus)._M_p;
          local_510._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_510,pcVar3,pcVar3 + psVar10->_M_string_length);
          cmsys::SystemTools::ConvertToUnixSlashes(&local_510);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_298,"  include(\"",0xb);
          poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_298,local_510._M_dataplus._M_p,
                               local_510._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar12,"/cmake_install.cmake\")\n",0x17);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_510._M_dataplus._M_p != paVar1) {
            operator_delete(local_510._M_dataplus._M_p,local_510.field_2._M_allocated_capacity + 1);
          }
        }
        this_00 = this_00 + 1;
      } while (this_00 !=
               local_468.super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>.
               _M_impl.super__Vector_impl_data._M_finish);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_298,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_298,"endif()\n\n",9);
  }
  if (local_468.super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>._M_impl.
      super__Vector_impl_data._M_start != (cmStateSnapshot *)0x0) {
    operator_delete(local_468.super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_468.
                          super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_468.
                          super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
LAB_0027897c:
  if ((char)local_514 != '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_298,
               "if(CMAKE_INSTALL_COMPONENT)\n  set(CMAKE_INSTALL_MANIFEST \"install_manifest_${CMAKE_INSTALL_COMPONENT}.txt\")\nelse()\n  set(CMAKE_INSTALL_MANIFEST \"install_manifest.txt\")\nendif()\n\nstring(REPLACE \";\" \"\\n\" CMAKE_INSTALL_MANIFEST_CONTENT\n       \"${CMAKE_INSTALL_MANIFEST_FILES}\")\nfile(WRITE \""
               ,0x11e);
    poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_298,(char *)local_490,local_488);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar12,"/${CMAKE_INSTALL_MANIFEST}\"\n     \"${CMAKE_INSTALL_MANIFEST_CONTENT}\")\n"
               ,0x46);
  }
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_298);
  if (local_490 != local_480) {
    operator_delete(local_490,local_480[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_450._M_dataplus._M_p != &local_450.field_2) {
    operator_delete(local_450._M_dataplus._M_p,local_450.field_2._M_allocated_capacity + 1);
  }
  if (local_4c8 != local_4b8) {
    operator_delete(local_4c8,local_4b8[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_430._M_dataplus._M_p != &local_430.field_2) {
    operator_delete(local_430._M_dataplus._M_p,local_430.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_4a8);
  if (local_4e8 != local_4d8) {
    operator_delete(local_4e8,local_4d8[0] + 1);
  }
  return;
}

Assistant:

void cmLocalGenerator::GenerateInstallRules()
{
  // Compute the install prefix.
  cmValue installPrefix =
    this->Makefile->GetDefinition("CMAKE_INSTALL_PREFIX");
  std::string prefix = installPrefix;

#if defined(_WIN32) && !defined(__CYGWIN__)
  if (!installPrefix) {
    if (!cmSystemTools::GetEnv("SystemDrive", prefix)) {
      prefix = "C:";
    }
    cmValue project_name = this->Makefile->GetDefinition("PROJECT_NAME");
    if (cmNonempty(project_name)) {
      prefix += "/Program Files/";
      prefix += *project_name;
    } else {
      prefix += "/InstalledCMakeProject";
    }
  }
#elif defined(__HAIKU__)
  char dir[B_PATH_NAME_LENGTH];
  if (!installPrefix) {
    if (find_directory(B_SYSTEM_DIRECTORY, -1, false, dir, sizeof(dir)) ==
        B_OK) {
      prefix = dir;
    } else {
      prefix = "/boot/system";
    }
  }
#else
  if (!installPrefix) {
    prefix = "/usr/local";
  }
#endif
  if (cmValue stagingPrefix =
        this->Makefile->GetDefinition("CMAKE_STAGING_PREFIX")) {
    prefix = *stagingPrefix;
  }

  // Compute the set of configurations.
  std::vector<std::string> configurationTypes =
    this->Makefile->GetGeneratorConfigs(cmMakefile::OnlyMultiConfig);
  std::string config = this->Makefile->GetDefaultConfiguration();

  // Choose a default install configuration.
  std::string default_config = config;
  const char* default_order[] = { "RELEASE", "MINSIZEREL", "RELWITHDEBINFO",
                                  "DEBUG", nullptr };
  for (const char** c = default_order; *c && default_config.empty(); ++c) {
    for (std::string const& configurationType : configurationTypes) {
      if (cmSystemTools::UpperCase(configurationType) == *c) {
        default_config = configurationType;
      }
    }
  }
  if (default_config.empty() && !configurationTypes.empty()) {
    default_config = configurationTypes[0];
  }

  // Create the install script file.
  std::string file = this->StateSnapshot.GetDirectory().GetCurrentBinary();
  std::string homedir = this->GetState()->GetBinaryDirectory();
  int toplevel_install = 0;
  if (file == homedir) {
    toplevel_install = 1;
  }
  file += "/cmake_install.cmake";
  cmGeneratedFileStream fout(file);
  fout.SetCopyIfDifferent(true);

  // Write the header.
  /* clang-format off */
  fout << "# Install script for directory: "
       << this->StateSnapshot.GetDirectory().GetCurrentSource()
       << "\n\n"
          "# Set the install prefix\n"
          "if(NOT DEFINED CMAKE_INSTALL_PREFIX)\n"
          "  set(CMAKE_INSTALL_PREFIX \"" << prefix << "\")\n"
          "endif()\n"
       << R"(string(REGEX REPLACE "/$" "" CMAKE_INSTALL_PREFIX )"
       << "\"${CMAKE_INSTALL_PREFIX}\")\n\n";
  /* clang-format on */

  // Write support code for generating per-configuration install rules.
  /* clang-format off */
  fout <<
    "# Set the install configuration name.\n"
    "if(NOT DEFINED CMAKE_INSTALL_CONFIG_NAME)\n"
    "  if(BUILD_TYPE)\n"
    "    string(REGEX REPLACE \"^[^A-Za-z0-9_]+\" \"\"\n"
    "           CMAKE_INSTALL_CONFIG_NAME \"${BUILD_TYPE}\")\n"
    "  else()\n"
    "    set(CMAKE_INSTALL_CONFIG_NAME \"" << default_config << "\")\n"
    "  endif()\n"
    "  message(STATUS \"Install configuration: "
    "\\\"${CMAKE_INSTALL_CONFIG_NAME}\\\"\")\n"
    "endif()\n"
    "\n";
  /* clang-format on */

  // Write support code for dealing with component-specific installs.
  /* clang-format off */
  fout <<
    "# Set the component getting installed.\n"
    "if(NOT CMAKE_INSTALL_COMPONENT)\n"
    "  if(COMPONENT)\n"
    "    message(STATUS \"Install component: \\\"${COMPONENT}\\\"\")\n"
    "    set(CMAKE_INSTALL_COMPONENT \"${COMPONENT}\")\n"
    "  else()\n"
    "    set(CMAKE_INSTALL_COMPONENT)\n"
    "  endif()\n"
    "endif()\n"
    "\n";
  /* clang-format on */

  // Copy user-specified install options to the install code.
  if (cmValue so_no_exe =
        this->Makefile->GetDefinition("CMAKE_INSTALL_SO_NO_EXE")) {
    /* clang-format off */
    fout <<
      "# Install shared libraries without execute permission?\n"
      "if(NOT DEFINED CMAKE_INSTALL_SO_NO_EXE)\n"
      "  set(CMAKE_INSTALL_SO_NO_EXE \"" << *so_no_exe << "\")\n"
      "endif()\n"
      "\n";
    /* clang-format on */
  }

  // Copy cmake cross compile state to install code.
  if (cmValue crosscompiling =
        this->Makefile->GetDefinition("CMAKE_CROSSCOMPILING")) {
    /* clang-format off */
    fout <<
      "# Is this installation the result of a crosscompile?\n"
      "if(NOT DEFINED CMAKE_CROSSCOMPILING)\n"
      "  set(CMAKE_CROSSCOMPILING \"" << *crosscompiling << "\")\n"
      "endif()\n"
      "\n";
    /* clang-format on */
  }

  // Write default directory permissions.
  if (cmValue defaultDirPermissions = this->Makefile->GetDefinition(
        "CMAKE_INSTALL_DEFAULT_DIRECTORY_PERMISSIONS")) {
    /* clang-format off */
    fout <<
      "# Set default install directory permissions.\n"
      "if(NOT DEFINED CMAKE_INSTALL_DEFAULT_DIRECTORY_PERMISSIONS)\n"
      "  set(CMAKE_INSTALL_DEFAULT_DIRECTORY_PERMISSIONS \""
         << *defaultDirPermissions << "\")\n"
      "endif()\n"
      "\n";
    /* clang-format on */
  }

  // Write out CMAKE_GET_RUNTIME_DEPENDENCIES_PLATFORM so that
  // installed code that uses `file(GET_RUNTIME_DEPENDENCIES)`
  // has same platform variable as when running cmake
  if (cmValue platform = this->Makefile->GetDefinition(
        "CMAKE_GET_RUNTIME_DEPENDENCIES_PLATFORM")) {
    /* clang-format off */
    fout <<
      "# Set default install directory permissions.\n"
      "if(NOT DEFINED CMAKE_GET_RUNTIME_DEPENDENCIES_PLATFORM)\n"
      "  set(CMAKE_GET_RUNTIME_DEPENDENCIES_PLATFORM \""
         << *platform << "\")\n"
      "endif()\n"
      "\n";
    /* clang-format on */
  }

  // Write out CMAKE_GET_RUNTIME_DEPENDENCIES_TOOL so that
  // installed code that uses `file(GET_RUNTIME_DEPENDENCIES)`
  // has same tool selected as when running cmake
  if (cmValue command =
        this->Makefile->GetDefinition("CMAKE_GET_RUNTIME_DEPENDENCIES_TOOL")) {
    /* clang-format off */
    fout <<
      "# Set default install directory permissions.\n"
      "if(NOT DEFINED CMAKE_GET_RUNTIME_DEPENDENCIES_TOOL)\n"
      "  set(CMAKE_GET_RUNTIME_DEPENDENCIES_TOOL \""
         << *command << "\")\n"
      "endif()\n"
      "\n";
    /* clang-format on */
  }

  // Write out CMAKE_GET_RUNTIME_DEPENDENCIES_COMMAND so that
  // installed code that uses `file(GET_RUNTIME_DEPENDENCIES)`
  // has same path to the tool as when running cmake
  if (cmValue command = this->Makefile->GetDefinition(
        "CMAKE_GET_RUNTIME_DEPENDENCIES_COMMAND")) {
    /* clang-format off */
    fout <<
      "# Set default install directory permissions.\n"
      "if(NOT DEFINED CMAKE_GET_RUNTIME_DEPENDENCIES_COMMAND)\n"
      "  set(CMAKE_GET_RUNTIME_DEPENDENCIES_COMMAND \""
         << *command << "\")\n"
      "endif()\n"
      "\n";
    /* clang-format on */
  }

  // Write out CMAKE_OBJDUMP so that installed code that uses
  // `file(GET_RUNTIME_DEPENDENCIES)` and hasn't specified
  // CMAKE_GET_RUNTIME_DEPENDENCIES_COMMAND has consistent
  // logic to fallback to CMAKE_OBJDUMP when `objdump` is
  // not on the path
  if (cmValue command = this->Makefile->GetDefinition("CMAKE_OBJDUMP")) {
    /* clang-format off */
    fout <<
      "# Set default install directory permissions.\n"
      "if(NOT DEFINED CMAKE_OBJDUMP)\n"
      "  set(CMAKE_OBJDUMP \""
         << *command << "\")\n"
      "endif()\n"
      "\n";
    /* clang-format on */
  }

  this->AddGeneratorSpecificInstallSetup(fout);

  // Ask each install generator to write its code.
  cmPolicies::PolicyStatus status = this->GetPolicyStatus(cmPolicies::CMP0082);
  auto const& installers = this->Makefile->GetInstallGenerators();
  bool haveSubdirectoryInstall = false;
  bool haveInstallAfterSubdirectory = false;
  if (status == cmPolicies::WARN) {
    for (const auto& installer : installers) {
      installer->CheckCMP0082(haveSubdirectoryInstall,
                              haveInstallAfterSubdirectory);
      installer->Generate(fout, config, configurationTypes);
    }
  } else {
    for (const auto& installer : installers) {
      installer->Generate(fout, config, configurationTypes);
    }
  }

  // Write rules from old-style specification stored in targets.
  this->GenerateTargetInstallRules(fout, config, configurationTypes);

  // Include install scripts from subdirectories.
  switch (status) {
    case cmPolicies::WARN:
      if (haveInstallAfterSubdirectory &&
          this->Makefile->PolicyOptionalWarningEnabled(
            "CMAKE_POLICY_WARNING_CMP0082")) {
        std::ostringstream e;
        e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0082) << "\n";
        this->IssueMessage(MessageType::AUTHOR_WARNING, e.str());
      }
      CM_FALLTHROUGH;
    case cmPolicies::OLD: {
      std::vector<cmStateSnapshot> children =
        this->Makefile->GetStateSnapshot().GetChildren();
      if (!children.empty()) {
        fout << "if(NOT CMAKE_INSTALL_LOCAL_ONLY)\n";
        fout << "  # Include the install script for each subdirectory.\n";
        for (cmStateSnapshot const& c : children) {
          if (!c.GetDirectory().GetPropertyAsBool("EXCLUDE_FROM_ALL")) {
            std::string odir = c.GetDirectory().GetCurrentBinary();
            cmSystemTools::ConvertToUnixSlashes(odir);
            fout << "  include(\"" << odir << "/cmake_install.cmake\")\n";
          }
        }
        fout << "\n";
        fout << "endif()\n\n";
      }
    } break;

    case cmPolicies::REQUIRED_IF_USED:
    case cmPolicies::REQUIRED_ALWAYS:
    case cmPolicies::NEW:
      // NEW behavior is handled in
      // cmInstallSubdirectoryGenerator::GenerateScript()
      break;
  }

  // Record the install manifest.
  if (toplevel_install) {
    /* clang-format off */
    fout <<
      "if(CMAKE_INSTALL_COMPONENT)\n"
      "  set(CMAKE_INSTALL_MANIFEST \"install_manifest_"
      "${CMAKE_INSTALL_COMPONENT}.txt\")\n"
      "else()\n"
      "  set(CMAKE_INSTALL_MANIFEST \"install_manifest.txt\")\n"
      "endif()\n"
      "\n"
      "string(REPLACE \";\" \"\\n\" CMAKE_INSTALL_MANIFEST_CONTENT\n"
      "       \"${CMAKE_INSTALL_MANIFEST_FILES}\")\n"
      "file(WRITE \"" << homedir << "/${CMAKE_INSTALL_MANIFEST}\"\n"
      "     \"${CMAKE_INSTALL_MANIFEST_CONTENT}\")\n";
    /* clang-format on */
  }
}